

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_vfs * sqlite3_vfs_find(char *zVfs)

{
  sqlite3_vfs *psVar1;
  bool bVar2;
  int iVar3;
  sqlite3_mutex *psVar4;
  sqlite3_vfs **ppsVar5;
  
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    bVar2 = true;
    if ((sqlite3Config.bCoreMutex == 0) ||
       (psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar4 == (sqlite3_mutex *)0x0)) {
      psVar4 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(psVar4);
      bVar2 = false;
    }
    ppsVar5 = &vfsList;
    while (((psVar1 = *ppsVar5, zVfs != (char *)0x0 && (psVar1 != (sqlite3_vfs *)0x0)) &&
           (iVar3 = strcmp(zVfs,psVar1->zName), iVar3 != 0))) {
      ppsVar5 = &psVar1->pNext;
    }
    if (!bVar2) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar4);
    }
    return psVar1;
  }
  return (sqlite3_vfs *)0x0;
}

Assistant:

SQLITE_API sqlite3_vfs *sqlite3_vfs_find(const char *zVfs){
  sqlite3_vfs *pVfs = 0;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return 0;
#endif
#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  for(pVfs = vfsList; pVfs; pVfs=pVfs->pNext){
    if( zVfs==0 ) break;
    if( strcmp(zVfs, pVfs->zName)==0 ) break;
  }
  sqlite3_mutex_leave(mutex);
  return pVfs;
}